

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  long *plVar4;
  int iVar5;
  undefined1 (*__ptr) [16];
  long *returnvalue;
  long *returnvalue_00;
  undefined8 *returnvalue_01;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  int retval;
  void *local_d8;
  void *local_d0;
  int indexB2;
  int indexB1;
  SUNContext sunctx;
  sunrealtype time;
  void *local_b0;
  long *local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  long *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  double local_68;
  undefined8 *local_60;
  int ncheck;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  __ptr = (undefined1 (*) [16])malloc(0x10);
  *(undefined4 *)*__ptr = 0;
  *(undefined4 *)(*__ptr + 4) = 0x3ff00000;
  *(undefined4 *)(*__ptr + 8) = 0;
  *(undefined4 *)(*__ptr + 0xc) = 0x40000000;
  retval = SUNContext_Create(0,&sunctx);
  iVar8 = 1;
  iVar5 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar5 == 0) {
    returnvalue = (long *)N_VNew_Serial(3,sunctx);
    iVar5 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar5 == 0) {
      N_VConst(0,returnvalue);
      returnvalue_00 = (long *)N_VNew_Serial(1,sunctx);
      iVar5 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar5 == 0) {
        N_VConst(0,returnvalue_00);
        returnvalue_01 = (undefined8 *)N_VCloneVectorArray(2,returnvalue);
        iVar5 = check_retval(returnvalue_01,"N_VCloneVectorArray",0);
        if (iVar5 == 0) {
          N_VConst(0,*returnvalue_01);
          N_VConst(0,returnvalue_01[1]);
          puVar6 = (undefined8 *)N_VCloneVectorArray(2,returnvalue_00);
          iVar5 = check_retval(puVar6,"N_VCloneVectorArray",0);
          if (iVar5 == 0) {
            N_VConst(0,*puVar6);
            local_60 = puVar6;
            N_VConst(0,puVar6[1]);
            pvVar7 = (void *)CVodeCreate(2,sunctx);
            local_d0 = pvVar7;
            iVar5 = check_retval(pvVar7,"CVodeCreate",0);
            if (iVar5 == 0) {
              retval = CVodeInit(0,pvVar7,f,returnvalue);
              iVar8 = 1;
              iVar5 = check_retval(&retval,"CVodeInit",1);
              if (iVar5 == 0) {
                retval = CVodeSStolerances(0xe2308c3a,0x3e45798ee2308c3a,pvVar7);
                iVar8 = 1;
                iVar5 = check_retval(&retval,"CVodeSStolerances",1);
                if (iVar5 == 0) {
                  local_d8 = pvVar7;
                  retval = CVodeSetUserData(pvVar7,__ptr);
                  iVar8 = 1;
                  iVar5 = check_retval(&retval,"CVodeSetUserData",1);
                  if (iVar5 == 0) {
                    pvVar7 = (void *)SUNDenseMatrix(3,3,sunctx);
                    iVar5 = check_retval(pvVar7,"SUNDenseMatrix",0);
                    if (iVar5 == 0) {
                      local_98 = (void *)SUNLinSol_Dense(returnvalue,pvVar7,sunctx);
                      iVar5 = check_retval(local_98,"SUNLinSol_Dense",0);
                      if (iVar5 == 0) {
                        retval = CVodeSetLinearSolver(local_d8,local_98,pvVar7);
                        iVar8 = 1;
                        iVar5 = check_retval(&retval,"CVodeSetLinearSolver",1);
                        if (iVar5 == 0) {
                          retval = CVodeQuadInit(local_d8,fQ,returnvalue_00);
                          iVar8 = 1;
                          iVar5 = check_retval(&retval,"CVodeQuadInit",1);
                          if (iVar5 == 0) {
                            retval = CVodeQuadSStolerances(0xe2308c3a,0x3e45798ee2308c3a,local_d8);
                            iVar8 = 1;
                            iVar5 = check_retval(&retval,"CVodeQuadSStolerances",1);
                            if (iVar5 == 0) {
                              iVar8 = 1;
                              retval = CVodeSetQuadErrCon(local_d8,1);
                              iVar5 = check_retval(&retval,"CVodeSetQuadErrCon",1);
                              if (iVar5 == 0) {
                                iVar8 = 1;
                                retval = CVodeSensInit(local_d8,2,1,fS,returnvalue_01);
                                iVar5 = check_retval(&retval,"CVodeSensInit",1);
                                if (iVar5 == 0) {
                                  retval = CVodeSensEEtolerances(local_d8);
                                  iVar8 = 1;
                                  iVar5 = check_retval(&retval,"CVodeSensEEtolerances",1);
                                  if (iVar5 == 0) {
                                    iVar8 = 1;
                                    retval = CVodeSetSensErrCon(local_d8,1);
                                    iVar5 = check_retval(&retval,"CVodeSetSensErrCon",1);
                                    if (iVar5 == 0) {
                                      retval = CVodeQuadSensInit(local_d8,fQS,local_60);
                                      iVar8 = 1;
                                      iVar5 = check_retval(&retval,"CVodeQuadSensInit",1);
                                      if (iVar5 == 0) {
                                        retval = CVodeQuadSensEEtolerances(local_d8);
                                        iVar8 = 1;
                                        iVar5 = check_retval(&retval,"CVodeQuadSensEEtolerances",1);
                                        if (iVar5 == 0) {
                                          iVar8 = 1;
                                          retval = CVodeSetQuadSensErrCon(local_d8,1);
                                          iVar5 = check_retval(&retval,"CVodeSetQuadSensErrCon",1);
                                          if (iVar5 == 0) {
                                            retval = CVodeAdjInit(local_d8,100,2);
                                            iVar8 = 1;
                                            iVar5 = check_retval(&retval,"CVodeAdjInit",1);
                                            if (iVar5 == 0) {
                                              puts("-------------------");
                                              puts("Forward integration");
                                              puts("-------------------\n");
                                              iVar8 = 1;
                                              retval = CVodeF(0,local_d8,returnvalue,&time,1,&ncheck
                                                             );
                                              iVar5 = check_retval(&retval,"CVodeF",1);
                                              if (iVar5 == 0) {
                                                retval = CVodeGetQuad(local_d8,&time,returnvalue_00)
                                                ;
                                                iVar8 = 1;
                                                iVar5 = check_retval(&retval,"CVodeGetQuad",1);
                                                if (iVar5 == 0) {
                                                  local_68 = **(double **)(*returnvalue_00 + 0x10);
                                                  retval = CVodeGetSens(local_d8,&time,
                                                                        returnvalue_01);
                                                  iVar8 = 1;
                                                  iVar5 = check_retval(&retval,"CVodeGetSens",1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeGetQuadSens(local_d8,&time,
                                                                              local_60);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeGetQuadSens",
                                                                         1);
                                                    if (iVar5 == 0) {
                                                      printf("ncheck = %d\n",(ulong)(uint)ncheck);
                                                      putchar(10);
                                                      puVar6 = *(undefined8 **)(*returnvalue + 0x10)
                                                      ;
                                                      printf("     y:    %12.4e %12.4e %12.4e",
                                                             (int)*puVar6,puVar6[1],puVar6[2]);
                                                      printf("     G:    %12.4e\n",
                                                             (int)**(undefined8 **)
                                                                    (*returnvalue_00 + 0x10));
                                                      putchar(10);
                                                      puVar6 = *(undefined8 **)
                                                                (*(long *)*returnvalue_01 + 0x10);
                                                      printf("     yS1:  %12.4e %12.4e %12.4e\n",
                                                             (int)*puVar6,puVar6[1],puVar6[2]);
                                                      puVar6 = *(undefined8 **)
                                                                (*(long *)returnvalue_01[1] + 0x10);
                                                      printf("     yS2:  %12.4e %12.4e %12.4e\n",
                                                             (int)*puVar6,puVar6[1],puVar6[2]);
                                                      putchar(10);
                                                      printf("   dG/dp:  %12.4e %12.4e\n",
                                                             (int)**(undefined8 **)
                                                                    (*(long *)*local_60 + 0x10),
                                                             **(undefined8 **)
                                                               (*(long *)local_60[1] + 0x10));
                                                      putchar(10);
                                                      puts("Final Statistics for forward pb.");
                                                      puts("--------------------------------");
                                                      retval = PrintFwdStats(local_d8);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"PrintFwdStats",1
                                                                          );
                                                      if (iVar5 == 0) {
                                                        local_80 = (void *)N_VNew_Serial(6,sunctx);
                                                        iVar5 = check_retval(local_80,
                                                  "N_VNew_Serial",0);
                                                  if (iVar5 == 0) {
                                                    N_VConst(0,local_80);
                                                    local_88 = (long *)N_VNew_Serial(4,sunctx);
                                                    iVar5 = check_retval(local_88,"N_VNew_Serial",0)
                                                    ;
                                                    if (iVar5 == 0) {
                                                      N_VConst(0,local_88);
                                                      local_90 = (void *)N_VNew_Serial(6,sunctx);
                                                      iVar5 = check_retval(local_90,"N_VNew_Serial",
                                                                           0);
                                                      if (iVar5 == 0) {
                                                        N_VConst(0,local_90);
                                                        local_a8 = (long *)N_VNew_Serial(4,sunctx);
                                                        iVar5 = check_retval(local_a8,
                                                  "N_VNew_Serial",0);
                                                  if (iVar5 == 0) {
                                                    N_VConst(0,local_a8);
                                                    retval = CVodeCreateB(local_d8,2,&indexB1);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeCreateB",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeInitBS(0,local_d8,indexB1,fB1,
                                                                           local_80);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeInitBS",1);
                                                      if (iVar5 == 0) {
                                                        retval = CVodeSStolerancesB(0xe2308c3a,
                                                                                                                                                                        
                                                  0x3e45798ee2308c3a,local_d8,indexB1);
                                                  iVar8 = 1;
                                                  iVar5 = check_retval(&retval,"CVodeSStolerancesB",
                                                                       1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetUserDataB(local_d8,indexB1,
                                                                               __ptr);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeSetUserDataB"
                                                                         ,1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeQuadInitBS(local_d8,indexB1,fQB1
                                                                               ,local_88);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeQuadInitBS"
                                                                           ,1);
                                                      if (iVar5 == 0) {
                                                        retval = CVodeQuadSStolerancesB
                                                                           (0xe2308c3a,
                                                                            0x3e45798ee2308c3a,
                                                                            local_d8,indexB1);
                                                        iVar8 = 1;
                                                        iVar5 = check_retval(&retval,
                                                  "CVodeQuadSStolerancesB",1);
                                                  if (iVar5 == 0) {
                                                    iVar8 = 1;
                                                    retval = CVodeSetQuadErrConB(local_d8,indexB1,1)
                                                    ;
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetQuadErrConB",1);
                                                  if (iVar5 == 0) {
                                                    local_a0 = (void *)SUNDenseMatrix(6,6,sunctx);
                                                    iVar5 = check_retval(pvVar7,"SUNDenseMatrix",0);
                                                    if (iVar5 == 0) {
                                                      local_70 = (void *)SUNLinSol_Dense(local_80,
                                                  local_a0,sunctx);
                                                  iVar5 = check_retval(local_70,"SUNLinSol_Dense",0)
                                                  ;
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetLinearSolverB
                                                                       (local_d8,indexB1,local_70,
                                                                        local_a0);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetLinearSolverB",1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeCreateB(local_d8,2,&indexB2);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeCreateB",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeInitBS(0,local_d8,indexB2,fB2,
                                                                           local_90);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeInitBS",1);
                                                      if (iVar5 == 0) {
                                                        retval = CVodeSStolerancesB(0xe2308c3a,
                                                                                                                                                                        
                                                  0x3e45798ee2308c3a,local_d8,indexB2);
                                                  iVar8 = 1;
                                                  iVar5 = check_retval(&retval,"CVodeSStolerancesB",
                                                                       1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetUserDataB(local_d8,indexB2,
                                                                               __ptr);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeSetUserDataB"
                                                                         ,1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeQuadInitBS(local_d8,indexB2,fQB2
                                                                               ,local_a8);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeQuadInitBS"
                                                                           ,1);
                                                      if (iVar5 == 0) {
                                                        retval = CVodeQuadSStolerancesB
                                                                           (0xe2308c3a,
                                                                            0x3e45798ee2308c3a,
                                                                            local_d8,indexB2);
                                                        iVar8 = 1;
                                                        iVar5 = check_retval(&retval,
                                                  "CVodeQuadSStolerancesB",1);
                                                  if (iVar5 == 0) {
                                                    iVar8 = 1;
                                                    retval = CVodeSetQuadErrConB(local_d8,indexB2,1)
                                                    ;
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetQuadErrConB",1);
                                                  if (iVar5 == 0) {
                                                    local_b0 = (void *)SUNDenseMatrix(6,6,sunctx);
                                                    iVar5 = check_retval(local_b0,"SUNDenseMatrix",0
                                                                        );
                                                    if (iVar5 == 0) {
                                                      local_78 = (void *)SUNLinSol_Dense(local_90,
                                                  local_b0,sunctx);
                                                  iVar5 = check_retval(local_78,"SUNLinSol_Dense",0)
                                                  ;
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetLinearSolverB
                                                                       (local_d8,indexB2,local_78,
                                                                        local_b0);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetLinearSolverB",1);
                                                  if (iVar5 == 0) {
                                                    puts(
                                                  "---------------------------------------------");
                                                  puts(
                                                  "Backward integration ... (2 adjoint problems)");
                                                  puts(
                                                  "---------------------------------------------\n")
                                                  ;
                                                  iVar8 = 1;
                                                  retval = CVodeB(0,local_d8,1);
                                                  iVar5 = check_retval(&retval,"CVodeB",1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeGetB(local_d8,indexB1,&time,
                                                                       local_80);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeGetB",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeGetQuadB(local_d8,indexB1,&time,
                                                                             local_88);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeGetQuadB",1
                                                                          );
                                                      if (iVar5 == 0) {
                                                        retval = CVodeGetB(local_d8,indexB2,&time,
                                                                           local_90);
                                                        iVar8 = 1;
                                                        iVar5 = check_retval(&retval,"CVodeGetB",1);
                                                        if (iVar5 == 0) {
                                                          retval = CVodeGetQuadB(local_d8,indexB2,
                                                                                 &time,local_a8);
                                                          iVar8 = 1;
                                                          iVar5 = check_retval(&retval,
                                                  "CVodeGetQuadB",1);
                                                  plVar4 = local_88;
                                                  if (iVar5 == 0) {
                                                    uVar1 = (*(undefined8 **)(*local_88 + 0x10))[1];
                                                    printf(
                                                  "   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n"
                                                  ,(uint)**(undefined8 **)(*local_88 + 0x10) ^
                                                   (uint)DAT_00105020,
                                                  CONCAT44((uint)((ulong)uVar1 >> 0x20) ^
                                                           DAT_00105020._4_4_,
                                                           (uint)uVar1 ^ (uint)DAT_00105020));
                                                  uVar1 = (*(undefined8 **)(*local_a8 + 0x10))[1];
                                                  printf(
                                                  "           %12.4e %12.4e   (from backward pb. 2)\n"
                                                  ,(uint)**(undefined8 **)(*local_a8 + 0x10) ^
                                                   (uint)DAT_00105020,
                                                  CONCAT44((uint)((ulong)uVar1 >> 0x20) ^
                                                           DAT_00105020._4_4_,
                                                           (uint)uVar1 ^ (uint)DAT_00105020));
                                                  putchar(10);
                                                  puts("   H = d2G/dp2:");
                                                  puts("        (1)            (2)");
                                                  uVar1 = *(undefined8 *)
                                                           (*(long *)(*local_a8 + 0x10) + 0x10);
                                                  printf("  %12.4e   %12.4e\n",
                                                         (uint)*(undefined8 *)
                                                                (*(long *)(*plVar4 + 0x10) + 0x10) ^
                                                         (uint)DAT_00105020,
                                                         CONCAT44((uint)((ulong)uVar1 >> 0x20) ^
                                                                  DAT_00105020._4_4_,
                                                                  (uint)uVar1 ^ (uint)DAT_00105020))
                                                  ;
                                                  printf("  %12.4e   %12.4e\n",
                                                         (int)*(undefined8 *)
                                                               (*(long *)(*plVar4 + 0x10) + 0x18),
                                                         *(ulong *)(*(long *)(*local_a8 + 0x10) +
                                                                   0x18) ^ 0x8000000000000000);
                                                  putchar(10);
                                                  puts("Final Statistics for backward pb. 1");
                                                  puts("-----------------------------------");
                                                  retval = PrintBckStats(local_d8,indexB1);
                                                  iVar8 = 1;
                                                  iVar5 = check_retval(&retval,"PrintBckStats",1);
                                                  if (iVar5 == 0) {
                                                    puts("Final Statistics for backward pb. 2");
                                                    puts("-----------------------------------");
                                                    retval = PrintBckStats(local_d8,indexB2);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"PrintBckStats",1);
                                                    if (iVar5 == 0) {
                                                      CVodeFree(&local_d0);
                                                      SUNLinSolFree(local_98);
                                                      SUNMatDestroy(pvVar7);
                                                      SUNLinSolFree(local_70);
                                                      SUNMatDestroy(local_a0);
                                                      SUNLinSolFree(local_78);
                                                      SUNMatDestroy(local_b0);
                                                      puts("-----------------------");
                                                      puts("Finite Difference tests");
                                                      puts("-----------------------\n");
                                                      printf("del_p = %g\n\n",0x47ae147b);
                                                      local_d0 = (void *)CVodeCreate(2,sunctx);
                                                      N_VConst(0,returnvalue);
                                                      N_VConst(0,returnvalue_00);
                                                      retval = CVodeInit(0,local_d0,f,returnvalue);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeInit",1);
                                                      if (iVar5 == 0) {
                                                        retval = CVodeSStolerances(0xe2308c3a,
                                                                                                                                                                      
                                                  0x3e45798ee2308c3a,local_d0);
                                                  iVar8 = 1;
                                                  iVar5 = check_retval(&retval,"CVodeSStolerances",1
                                                                      );
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetUserData(local_d0,__ptr);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeSetUserData",
                                                                         1);
                                                    if (iVar5 == 0) {
                                                      pvVar7 = (void *)SUNDenseMatrix(3,3,sunctx);
                                                      iVar5 = check_retval(pvVar7,"SUNDenseMatrix",0
                                                                          );
                                                      if (iVar5 == 0) {
                                                        local_a0 = (void *)SUNLinSol_Dense(
                                                  returnvalue,pvVar7,sunctx);
                                                  iVar5 = check_retval(local_a0,"SUNLinSol_Dense",0)
                                                  ;
                                                  if (iVar5 == 0) {
                                                    retval = CVodeSetLinearSolver
                                                                       (local_d0,local_a0,pvVar7);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetLinearSolver",1);
                                                  if (iVar5 == 0) {
                                                    retval = CVodeQuadInit(local_d0,fQ,
                                                                           returnvalue_00);
                                                    iVar8 = 1;
                                                    iVar5 = check_retval(&retval,"CVodeQuadInit",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeQuadSStolerances
                                                                         (0xe2308c3a,
                                                                          0x3e45798ee2308c3a,
                                                                          local_d0);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,
                                                  "CVodeQuadSStolerances",1);
                                                  if (iVar5 == 0) {
                                                    iVar8 = 1;
                                                    retval = CVodeSetQuadErrCon(local_d0,1);
                                                    iVar5 = check_retval(&retval,
                                                  "CVodeSetQuadErrCon",1);
                                                  if (iVar5 == 0) {
                                                    *(double *)*__ptr = *(double *)*__ptr + 0.01;
                                                    iVar8 = 1;
                                                    retval = CVode(0,local_d0,returnvalue,&time,1);
                                                    iVar5 = check_retval(&retval,"CVode",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeGetQuad(local_d0,&time,
                                                                            returnvalue_00);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeGetQuad",1)
                                                      ;
                                                      if (iVar5 == 0) {
                                                        local_d8 = (void *)**(double **)
                                                                             (*returnvalue_00 + 0x10
                                                                             );
                                                        puVar6 = *(undefined8 **)
                                                                  (*returnvalue + 0x10);
                                                        printf("p1+  y:   %12.4e %12.4e %12.4e",
                                                               (int)*puVar6,puVar6[1],puVar6[2]);
                                                        printf("     G:   %12.4e\n",
                                                               (int)**(undefined8 **)
                                                                      (*returnvalue_00 + 0x10));
                                                        *(double *)*__ptr =
                                                             *(double *)*__ptr + -0.02;
                                                        N_VConst(0,returnvalue);
                                                        N_VConst(0,returnvalue_00);
                                                        CVodeReInit(0,local_d0,returnvalue);
                                                        CVodeQuadReInit(local_d0,returnvalue_00);
                                                        iVar8 = 1;
                                                        retval = CVode(0,local_d0,returnvalue,&time,
                                                                       1);
                                                        iVar5 = check_retval(&retval,"CVode",1);
                                                        if (iVar5 == 0) {
                                                          retval = CVodeGetQuad(local_d0,&time,
                                                                                returnvalue_00);
                                                          iVar8 = 1;
                                                          iVar5 = check_retval(&retval,
                                                  "CVodeGetQuad",1);
                                                  if (iVar5 == 0) {
                                                    local_b0 = (void *)**(double **)
                                                                         (*returnvalue_00 + 0x10);
                                                    puVar6 = *(undefined8 **)(*returnvalue + 0x10);
                                                    printf("p1-  y:   %12.4e %12.4e %12.4e",
                                                           (int)*puVar6,puVar6[1],puVar6[2]);
                                                    printf("     G:   %12.4e\n",
                                                           (int)**(undefined8 **)
                                                                  (*returnvalue_00 + 0x10));
                                                    dVar3 = *(double *)(*__ptr + 8) + 0.01;
                                                    auVar2._8_4_ = SUB84(dVar3,0);
                                                    auVar2._0_8_ = *(double *)*__ptr + 0.01;
                                                    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
                                                    *__ptr = auVar2;
                                                    N_VConst(0,returnvalue);
                                                    N_VConst(0,returnvalue_00);
                                                    CVodeReInit(0,local_d0,returnvalue);
                                                    CVodeQuadReInit(local_d0,returnvalue_00);
                                                    iVar8 = 1;
                                                    retval = CVode(0,local_d0,returnvalue,&time,1);
                                                    iVar5 = check_retval(&retval,"CVode",1);
                                                    if (iVar5 == 0) {
                                                      retval = CVodeGetQuad(local_d0,&time,
                                                                            returnvalue_00);
                                                      iVar8 = 1;
                                                      iVar5 = check_retval(&retval,"CVodeGetQuad",1)
                                                      ;
                                                      if (iVar5 == 0) {
                                                        local_98 = (void *)**(double **)
                                                                             (*returnvalue_00 + 0x10
                                                                             );
                                                        puVar6 = *(undefined8 **)
                                                                  (*returnvalue + 0x10);
                                                        printf("p2+  y:   %12.4e %12.4e %12.4e",
                                                               (int)*puVar6,puVar6[1],puVar6[2]);
                                                        printf("     G:   %12.4e\n",
                                                               (int)**(undefined8 **)
                                                                      (*returnvalue_00 + 0x10));
                                                        *(double *)(*__ptr + 8) =
                                                             *(double *)(*__ptr + 8) + -0.02;
                                                        N_VConst(0,returnvalue);
                                                        N_VConst(0,returnvalue_00);
                                                        CVodeReInit(0,local_d0,returnvalue);
                                                        CVodeQuadReInit(local_d0,returnvalue_00);
                                                        iVar8 = 1;
                                                        retval = CVode(0,local_d0,returnvalue,&time,
                                                                       1);
                                                        iVar5 = check_retval(&retval,"CVode",1);
                                                        if (iVar5 == 0) {
                                                          retval = CVodeGetQuad(local_d0,&time,
                                                                                returnvalue_00);
                                                          iVar8 = 1;
                                                          iVar5 = check_retval(&retval,
                                                  "CVodeGetQuad",1);
                                                  if (iVar5 == 0) {
                                                    local_38 = ((double)local_d8 - local_68) / 0.01;
                                                    local_78 = (void *)((local_68 - (double)local_b0
                                                                        ) / 0.01);
                                                    local_70 = (void *)(((double)local_d8 -
                                                                        (double)local_b0) / 0.02);
                                                    local_40 = local_68 + local_68;
                                                    local_d8 = (void *)((((double)local_d8 -
                                                                         local_40) +
                                                                        (double)local_b0) / 0.0001);
                                                    local_b0 = (void *)**(double **)
                                                                         (*returnvalue_00 + 0x10);
                                                    puVar6 = *(undefined8 **)(*returnvalue + 0x10);
                                                    printf("p2-  y:   %12.4e %12.4e %12.4e",
                                                           (int)*puVar6,puVar6[1],puVar6[2]);
                                                    printf("     G:   %12.4e\n",
                                                           (int)**(undefined8 **)
                                                                  (*returnvalue_00 + 0x10));
                                                    *(double *)(*__ptr + 8) =
                                                         *(double *)(*__ptr + 8) + 0.01;
                                                    local_50 = ((double)local_98 - local_68) / 0.01;
                                                    local_68 = (local_68 - (double)local_b0) / 0.01;
                                                    local_48 = ((double)local_98 - (double)local_b0)
                                                               / 0.02;
                                                    local_98 = (void *)((((double)local_98 -
                                                                         local_40) +
                                                                        (double)local_b0) / 0.0001);
                                                    putchar(10);
                                                    printf("   dG/dp:  %12.4e %12.4e   (fwd FD)\n",
                                                           SUB84(local_38,0),local_50);
                                                    printf("           %12.4e %12.4e   (bck FD)\n",
                                                           (int)local_78,local_68);
                                                    printf("           %12.4e %12.4e   (cntr FD)\n",
                                                           (int)local_70,local_48);
                                                    putchar(10);
                                                    printf("  H(1,1):  %12.4e\n",(int)local_d8);
                                                    printf("  H(2,2):  %12.4e\n",(int)local_98);
                                                    CVodeFree(&local_d0);
                                                    SUNLinSolFree(local_a0);
                                                    SUNMatDestroy(pvVar7);
                                                    N_VDestroy(returnvalue);
                                                    N_VDestroy(returnvalue_00);
                                                    N_VDestroyVectorArray(returnvalue_01,2);
                                                    N_VDestroyVectorArray(local_60,2);
                                                    N_VDestroy(local_80);
                                                    N_VDestroy(local_88);
                                                    N_VDestroy(local_90);
                                                    N_VDestroy(local_a8);
                                                    SUNContext_Free(&sunctx);
                                                    free(__ptr);
                                                    iVar8 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB1, AB2;
  SUNLinearSolver LS, LSB1, LSB2;
  void* cvode_mem;

  sunindextype Neq, Np2;
  int Np;

  sunrealtype t0, tf;

  sunrealtype reltol;
  sunrealtype abstol, abstolQ, abstolB, abstolQB;

  N_Vector y, yQ;
  N_Vector *yS, *yQS;
  N_Vector yB1, yB2;
  N_Vector yQB1, yQB2;

  int steps, ncheck;
  int indexB1, indexB2;

  int retval;
  sunrealtype time;

  sunrealtype dp;
  sunrealtype G, Gp, Gm;
  sunrealtype grdG_fwd[2], grdG_bck[2], grdG_cntr[2];
  sunrealtype H11, H22;

  data = NULL;
  y = yQ = NULL;
  yB1 = yB2 = NULL;
  yQB1 = yQB2 = NULL;
  A = AB1 = AB2 = NULL;
  LS = LSB1 = LSB2 = NULL;
  cvode_mem        = NULL;

  /* User data structure */

  data     = (UserData)malloc(sizeof *data);
  data->p1 = SUN_RCONST(1.0);
  data->p2 = SUN_RCONST(2.0);

  /* Problem size, integration interval, and tolerances */

  Neq = 3;
  Np  = 2;
  Np2 = 2 * Np;

  t0 = 0.0;
  tf = 2.0;

  reltol = 1.0e-8;

  abstol  = 1.0e-8;
  abstolQ = 1.0e-8;

  abstolB  = 1.0e-8;
  abstolQB = 1.0e-8;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initializations for forward problem */

  y = N_VNew_Serial(Neq, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ONE, y);

  yQ = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)yQ, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQ);

  yS = N_VCloneVectorArray(Np, y);
  if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yS[0]);
  N_VConst(ZERO, yS[1]);

  yQS = N_VCloneVectorArray(Np, yQ);
  if (check_retval((void*)yQS, "N_VCloneVectorArray", 0)) { return (1); }
  N_VConst(ZERO, yQS[0]);
  N_VConst(ZERO, yQS[1]);

  /* Create and initialize forward problem */

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  retval = CVodeSensInit(cvode_mem, Np, CV_SIMULTANEOUS, fS, yS);
  if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

  retval = CVodeSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

  retval = CVodeQuadSensInit(cvode_mem, fQS, yQS);
  if (check_retval(&retval, "CVodeQuadSensInit", 1)) { return (1); }

  retval = CVodeQuadSensEEtolerances(cvode_mem);
  if (check_retval(&retval, "CVodeQuadSensEEtolerances", 1)) { return (1); }

  retval = CVodeSetQuadSensErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadSensErrCon", 1)) { return (1); }

  /* Initialize ASA */

  steps  = 100;
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Forward integration */

  printf("-------------------\n");
  printf("Forward integration\n");
  printf("-------------------\n\n");

  retval = CVodeF(cvode_mem, tf, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  G = Ith(yQ, 1);

  retval = CVodeGetSens(cvode_mem, &time, yS);
  if (check_retval(&retval, "CVodeGetSens", 1)) { return (1); }

  retval = CVodeGetQuadSens(cvode_mem, &time, yQS);
  if (check_retval(&retval, "CVodeGetQuadSens", 1)) { return (1); }

  printf("ncheck = %d\n", ncheck);
  printf("\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("     y:    %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4Le\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4Le %12.4Le %12.4Le\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#else
  printf("     y:    %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:    %12.4e\n", Ith(yQ, 1));
  printf("\n");
  printf("     yS1:  %12.4e %12.4e %12.4e\n", Ith(yS[0], 1), Ith(yS[0], 2),
         Ith(yS[0], 3));
  printf("     yS2:  %12.4e %12.4e %12.4e\n", Ith(yS[1], 1), Ith(yS[1], 2),
         Ith(yS[1], 3));
  printf("\n");
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(yQS[0], 1), Ith(yQS[1], 1));
#endif
  printf("\n");

  printf("Final Statistics for forward pb.\n");
  printf("--------------------------------\n");
  retval = PrintFwdStats(cvode_mem);
  if (check_retval(&retval, "PrintFwdStats", 1)) { return (1); }

  /* Initializations for backward problems */

  yB1 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB1);

  yQB1 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB1, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB1);

  yB2 = N_VNew_Serial(2 * Neq, sunctx);
  if (check_retval((void*)yB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB2);

  yQB2 = N_VNew_Serial(Np2, sunctx);
  if (check_retval((void*)yQB2, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yQB2);

  /* Create and initialize backward problems (one for each column of the Hessian) */

  /* -------------------------
     First backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB1);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB1, fB1, tf, yB1);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB1, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB1, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB1, fQB1, yQB1);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB1, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB1, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB1 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB1 = SUNLinSol_Dense(yB1, AB1, sunctx);
  if (check_retval((void*)LSB1, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB1, LSB1, AB1);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* -------------------------
     Second backward problem
     -------------------------*/

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB2);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeInitBS(cvode_mem, indexB2, fB2, tf, yB2);
  if (check_retval(&retval, "CVodeInitBS", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB2, reltol, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB2, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeQuadInitBS(cvode_mem, indexB2, fQB2, yQB2);
  if (check_retval(&retval, "CVodeQuadInitBS", 1)) { return (1); }

  retval = CVodeQuadSStolerancesB(cvode_mem, indexB2, reltol, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  retval = CVodeSetQuadErrConB(cvode_mem, indexB2, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  AB2 = SUNDenseMatrix(2 * Neq, 2 * Neq, sunctx);
  if (check_retval((void*)AB2, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LSB2 = SUNLinSol_Dense(yB2, AB2, sunctx);
  if (check_retval((void*)LSB2, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB2, LSB2, AB2);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Backward integration */

  printf("---------------------------------------------\n");
  printf("Backward integration ... (2 adjoint problems)\n");
  printf("---------------------------------------------\n\n");

  retval = CVodeB(cvode_mem, t0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB1, &time, yB1);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB1, &time, yQB1);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB2, &time, yB2);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB2, &time, yQB2);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4Le %12.4Le   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#else
  printf("   dG/dp:  %12.4e %12.4e   (from backward pb. 1)\n", -Ith(yQB1, 1),
         -Ith(yQB1, 2));
  printf("           %12.4e %12.4e   (from backward pb. 2)\n", -Ith(yQB2, 1),
         -Ith(yQB2, 2));
#endif
  printf("\n");
  printf("   H = d2G/dp2:\n");
  printf("        (1)            (2)\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4Le   %12.4Le\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#else
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 3), -Ith(yQB2, 3));
  printf("  %12.4e   %12.4e\n", -Ith(yQB1, 4), -Ith(yQB2, 4));
#endif
  printf("\n");

  printf("Final Statistics for backward pb. 1\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB1);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  printf("Final Statistics for backward pb. 2\n");
  printf("-----------------------------------\n");
  retval = PrintBckStats(cvode_mem, indexB2);
  if (check_retval(&retval, "PrintBckStats", 1)) { return (1); }

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB1);
  SUNMatDestroy(AB1);
  SUNLinSolFree(LSB2);
  SUNMatDestroy(AB2);

  /* Finite difference tests */

  dp = SUN_RCONST(1.0e-2);

  printf("-----------------------\n");
  printf("Finite Difference tests\n");
  printf("-----------------------\n\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("del_p = %Lg\n\n", dp);
#else
  printf("del_p = %g\n\n", dp);
#endif

  cvode_mem = CVodeCreate(CV_BDF, sunctx);

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create a dense SUNMatrix */
  A = SUNDenseMatrix(Neq, Neq, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  retval = CVodeQuadInit(cvode_mem, fQ, yQ);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  retval = CVodeQuadSStolerances(cvode_mem, reltol, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  data->p1 += dp;

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p1-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p1-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p1 += dp;

  grdG_fwd[0]  = (Gp - G) / dp;
  grdG_bck[0]  = (G - Gm) / dp;
  grdG_cntr[0] = (Gp - Gm) / (2.0 * dp);
  H11          = (Gp - 2.0 * G + Gm) / (dp * dp);

  data->p2 += dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gp = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2+  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2+  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 -= 2.0 * dp;

  N_VConst(ONE, y);
  N_VConst(ZERO, yQ);

  CVodeReInit(cvode_mem, t0, y);
  CVodeQuadReInit(cvode_mem, yQ);

  retval = CVode(cvode_mem, tf, y, &time, CV_NORMAL);
  if (check_retval(&retval, "CVode", 1)) { return (1); }

  retval = CVodeGetQuad(cvode_mem, &time, yQ);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  Gm = Ith(yQ, 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("p2-  y:   %12.4Le %12.4Le %12.4Le", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4Le\n", Ith(yQ, 1));
#else
  printf("p2-  y:   %12.4e %12.4e %12.4e", Ith(y, 1), Ith(y, 2), Ith(y, 3));
  printf("     G:   %12.4e\n", Ith(yQ, 1));
#endif
  data->p2 += dp;

  grdG_fwd[1]  = (Gp - G) / dp;
  grdG_bck[1]  = (G - Gm) / dp;
  grdG_cntr[1] = (Gp - Gm) / (2.0 * dp);
  H22          = (Gp - 2.0 * G + Gm) / (dp * dp);

  printf("\n");

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4Le %12.4Le   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4Le %12.4Le   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4Le\n", H11);
  printf("  H(2,2):  %12.4Le\n", H22);
#else
  printf("   dG/dp:  %12.4e %12.4e   (fwd FD)\n", grdG_fwd[0], grdG_fwd[1]);
  printf("           %12.4e %12.4e   (bck FD)\n", grdG_bck[0], grdG_bck[1]);
  printf("           %12.4e %12.4e   (cntr FD)\n", grdG_cntr[0], grdG_cntr[1]);
  printf("\n");
  printf("  H(1,1):  %12.4e\n", H11);
  printf("  H(2,2):  %12.4e\n", H22);
#endif

  /* Free memory */

  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(y);
  N_VDestroy(yQ);

  N_VDestroyVectorArray(yS, Np);
  N_VDestroyVectorArray(yQS, Np);

  N_VDestroy(yB1);
  N_VDestroy(yQB1);
  N_VDestroy(yB2);
  N_VDestroy(yQB2);

  SUNContext_Free(&sunctx);

  free(data);

  return (0);
}